

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

void JX9_OS_Const(jx9_value *pVal,void *pUnused)

{
  int iVar1;
  utsname sInfo;
  utsname local_18e;
  
  iVar1 = uname(&local_18e);
  if (iVar1 != 0) {
    jx9_value_string(pVal,"Unix",4);
    return;
  }
  jx9_value_string(pVal,local_18e.sysname,-1);
  return;
}

Assistant:

static void JX9_OS_Const(jx9_value *pVal, void *pUnused)
{
#if defined(__WINNT__)
	jx9_value_string(pVal, "WinNT", (int)sizeof("WinNT")-1);
#elif defined(__UNIXES__)
	struct utsname sInfo;
	if( uname(&sInfo) != 0 ){
		jx9_value_string(pVal, "Unix", (int)sizeof("Unix")-1);
	}else{
		jx9_value_string(pVal, sInfo.sysname, -1);
	}
#else
	jx9_value_string(pVal,"Host OS", (int)sizeof("Host OS")-1);
#endif
	SXUNUSED(pUnused);
}